

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlrelationaltablemodel.cpp
# Opt level: O0

QString * __thiscall QSqlRelationalTableModel::selectStatement(QSqlRelationalTableModel *this)

{
  bool bVar1;
  QChar QVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  QSqlRelationalTableModelPrivate *pQVar7;
  QSqlDriver *pQVar8;
  ulong uVar9;
  int *piVar10;
  QByteArrayView *this_00;
  fd_set *__exceptfds;
  fd_set *__writefds;
  long *in_RSI;
  QString *in_RDI;
  timeval *in_R8;
  long in_FS_OFFSET;
  QByteArrayView QVar11;
  int i_2;
  int i_1;
  int i;
  QSqlRelationalTableModelPrivate *d;
  QString where;
  QString stmt;
  QString cond;
  QString relTableField;
  QString tblexpr;
  QString alias;
  QString displayColumn;
  QString relTableName;
  QString displayTableField;
  QString relTableAlias;
  QString tableField;
  QSqlRelation relation_1;
  QString from;
  QString conditions;
  QString fList;
  QSqlRecord rec;
  QString name;
  QSqlRelation relation;
  QStringList fieldList;
  QHash<QString,_int> fieldNames;
  undefined4 in_stack_fffffffffffff9a8;
  SectionFlag in_stack_fffffffffffff9ac;
  QSqlRelationalTableModelPrivate *in_stack_fffffffffffff9b0;
  QSqlRelationalTableModelPrivate *in_stack_fffffffffffff9b8;
  QHash<QString,_int> *in_stack_fffffffffffff9c0;
  QSqlRelationalTableModelPrivate *in_stack_fffffffffffff9c8;
  undefined4 in_stack_fffffffffffff9d0;
  undefined4 in_stack_fffffffffffff9d4;
  int in_stack_fffffffffffff9d8;
  int in_stack_fffffffffffff9dc;
  int in_stack_fffffffffffff9e0;
  undefined4 in_stack_fffffffffffff9e4;
  QString *a;
  undefined2 uVar12;
  QFlagsStorage<QString::SectionFlag> in_stack_fffffffffffffa08;
  int iVar13;
  int local_5f0;
  int local_5ec;
  undefined1 local_5d0 [144];
  undefined8 local_540;
  undefined8 local_538;
  undefined8 local_530;
  undefined1 local_528 [24];
  undefined8 local_510;
  undefined8 local_508;
  undefined8 local_500;
  undefined1 local_4f8 [48];
  undefined1 local_4c8 [48];
  undefined1 local_498 [24];
  undefined1 local_480 [24];
  undefined1 local_468 [24];
  undefined8 local_450;
  undefined8 local_448;
  undefined8 local_440;
  undefined8 local_420;
  undefined8 local_418;
  undefined8 local_410;
  undefined8 local_3f0;
  undefined8 local_3e8;
  undefined8 local_3e0;
  undefined1 local_3d8 [24];
  undefined1 local_3c0 [24];
  undefined1 local_3a8 [24];
  timeval local_390;
  storage_type *local_378;
  undefined1 local_368 [24];
  undefined8 local_350;
  undefined8 local_348;
  undefined8 local_340;
  undefined1 local_338 [24];
  undefined8 local_320;
  undefined8 local_318;
  undefined8 local_310;
  undefined1 local_308 [56];
  undefined8 local_2d0;
  undefined8 local_2c8;
  undefined8 local_2c0;
  QString local_2a0;
  undefined8 local_288;
  undefined8 local_280;
  undefined8 local_278;
  undefined1 local_270 [24];
  undefined1 local_258 [48];
  undefined8 local_228;
  undefined8 local_220;
  undefined8 local_218;
  undefined1 local_200 [96];
  QString local_1a0;
  QString local_188;
  fd_set local_170;
  undefined8 local_e8;
  undefined1 local_e0 [48];
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined1 local_88 [72];
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  QHash<QString,_int> local_28 [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  a = in_RDI;
  pQVar7 = d_func((QSqlRelationalTableModel *)0x15a015);
  QSqlTableModel::tableName((QSqlTableModel *)in_stack_fffffffffffff9b8);
  bVar1 = QString::isEmpty((QString *)0x15a039);
  QString::~QString((QString *)0x15a04a);
  if (bVar1) {
    QString::QString((QString *)0x15a05e);
  }
  else {
    bVar1 = QList<QSharedPointer<QRelation>_>::isEmpty
                      ((QList<QSharedPointer<QRelation>_> *)0x15a074);
    if (bVar1) {
      QSqlTableModel::selectStatement
                ((QSqlTableModel *)CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0));
    }
    else {
      local_28[0].d = (Data *)0xaaaaaaaaaaaaaaaa;
      QHash<QString,_int>::QHash(local_28);
      local_40 = 0xaaaaaaaaaaaaaaaa;
      local_38 = 0xaaaaaaaaaaaaaaaa;
      local_30 = 0xaaaaaaaaaaaaaaaa;
      QList<QString>::QList((QList<QString> *)0x15a0e4);
      local_5ec = 0;
      while (iVar4 = local_5ec, iVar3 = QSqlRecord::count((QSqlRecord *)0x15a105), iVar4 < iVar3) {
        memset(local_88,0xaa,0x48);
        QList<QSharedPointer<QRelation>_>::value
                  ((QList<QSharedPointer<QRelation>_> *)
                   CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),
                   (qsizetype)in_stack_fffffffffffff9c8);
        bVar1 = QSharedPointer::operator_cast_to_bool((QSharedPointer<QRelation> *)0x15a155);
        if (bVar1) {
          QList<QSharedPointer<QRelation>_>::at
                    ((QList<QSharedPointer<QRelation>_> *)in_stack_fffffffffffff9b0,
                     CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
          QSharedPointer<QRelation>::operator->((QSharedPointer<QRelation> *)0x15a179);
          QSqlRelation::QSqlRelation
                    ((QSqlRelation *)in_stack_fffffffffffff9b0,
                     (QSqlRelation *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
        }
        else {
          QSqlRelation::QSqlRelation((QSqlRelation *)in_stack_fffffffffffff9b0);
        }
        QSharedPointer<QRelation>::~QSharedPointer((QSharedPointer<QRelation> *)0x15a1a5);
        local_b0 = 0xaaaaaaaaaaaaaaaa;
        local_a8 = 0xaaaaaaaaaaaaaaaa;
        local_a0 = 0xaaaaaaaaaaaaaaaa;
        QString::QString((QString *)0x15a1df);
        bVar1 = QSqlRelation::isValid((QSqlRelation *)in_stack_fffffffffffff9b0);
        if (bVar1) {
          QSqlRelation::displayColumn
                    ((QSqlRelation *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
          QString::operator=((QString *)in_stack_fffffffffffff9b0,
                             (QString *)
                             CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
          QString::~QString((QString *)0x15a22c);
          pQVar8 = QSqlDatabase::driver(&(pQVar7->super_QSqlTableModelPrivate).db);
          uVar9 = (**(code **)(*(long *)pQVar8 + 0xf0))(pQVar8,&local_b0,0);
          if ((uVar9 & 1) != 0) {
            pQVar8 = QSqlDatabase::driver(&(pQVar7->super_QSqlTableModelPrivate).db);
            (**(code **)(*(long *)pQVar8 + 0xf8))(local_e0,pQVar8,&local_b0,0);
            QString::operator=((QString *)in_stack_fffffffffffff9b0,
                               (QString *)
                               CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
            QString::~QString((QString *)0x15a2aa);
          }
          local_e8 = 0xaaaaaaaaaaaaaaaa;
          QSqlTableModel::database((QSqlTableModel *)in_stack_fffffffffffff9b8);
          QSqlRelation::tableName
                    ((QSqlRelation *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
          QSqlDatabase::record
                    ((QSqlDatabase *)in_stack_fffffffffffff9b8,(QString *)in_stack_fffffffffffff9b0)
          ;
          QString::~QString((QString *)0x15a30a);
          QSqlDatabase::~QSqlDatabase((QSqlDatabase *)in_stack_fffffffffffff9b0);
          local_5f0 = 0;
          while (in_stack_fffffffffffff9e0 = local_5f0,
                iVar4 = QSqlRecord::count((QSqlRecord *)0x15a334), in_stack_fffffffffffff9e0 < iVar4
                ) {
            QSqlRecord::fieldName
                      ((QSqlRecord *)in_stack_fffffffffffff9c8,
                       (int)((ulong)in_stack_fffffffffffff9c0 >> 0x20));
            in_stack_fffffffffffff9dc =
                 QString::compare((QString *)&local_b0,(int)&local_170 + 0x50);
            QString::~QString((QString *)0x15a383);
            if (in_stack_fffffffffffff9dc == 0) {
              QSqlRecord::fieldName
                        ((QSqlRecord *)in_stack_fffffffffffff9c8,
                         (int)((ulong)in_stack_fffffffffffff9c0 >> 0x20));
              QString::operator=((QString *)in_stack_fffffffffffff9b0,
                                 (QString *)
                                 CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
              QString::~QString((QString *)0x15a3c7);
              break;
            }
            local_5f0 = local_5f0 + 1;
          }
          QSqlRecord::~QSqlRecord((QSqlRecord *)0x15a3e8);
        }
        else {
          QSqlRecord::fieldName
                    ((QSqlRecord *)in_stack_fffffffffffff9c8,
                     (int)((ulong)in_stack_fffffffffffff9c0 >> 0x20));
          QString::operator=((QString *)in_stack_fffffffffffff9b0,
                             (QString *)
                             CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
          QString::~QString((QString *)0x15a429);
        }
        local_170.fds_bits[3]._4_4_ = 0;
        in_stack_fffffffffffff9d8 =
             QHash<QString,_int>::value
                       ((QHash<QString,_int> *)in_stack_fffffffffffff9b8,
                        (QString *)in_stack_fffffffffffff9b0,
                        (int *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
        in_stack_fffffffffffff9d8 = in_stack_fffffffffffff9d8 + 1;
        piVar10 = QHash<QString,_int>::operator[]
                            (in_stack_fffffffffffff9c0,(QString *)in_stack_fffffffffffff9b8);
        *piVar10 = in_stack_fffffffffffff9d8;
        QList<QString>::append
                  ((QList<QString> *)in_stack_fffffffffffff9b0,
                   (parameter_type)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
        QString::~QString((QString *)0x15a495);
        QSqlRelation::~QSqlRelation((QSqlRelation *)in_stack_fffffffffffff9b0);
        local_5ec = local_5ec + 1;
      }
      local_170.fds_bits[0] = -0x5555555555555556;
      local_170.fds_bits[1] = -0x5555555555555556;
      local_170.fds_bits[2] = -0x5555555555555556;
      QString::QString((QString *)0x15a4ec);
      local_188.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_188.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      local_188.d.size = -0x5555555555555556;
      QString::QString((QString *)0x15a526);
      local_1a0.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_1a0.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      local_1a0.d.size = -0x5555555555555556;
      QSqlTableModel::tableName((QSqlTableModel *)in_stack_fffffffffffff9b8);
      QSqlQueryModelSql::from((QString *)in_stack_fffffffffffff9c8);
      QString::~QString((QString *)0x15a587);
      iVar3 = 0;
      while( true ) {
        iVar13 = iVar3;
        uVar5 = QSqlRecord::count((QSqlRecord *)0x15a5a8);
        __exceptfds = (fd_set *)(ulong)uVar5;
        if ((int)uVar5 <= iVar3) break;
        memset(local_200,0xaa,0x48);
        QList<QSharedPointer<QRelation>_>::value
                  ((QList<QSharedPointer<QRelation>_> *)CONCAT44(iVar3,in_stack_fffffffffffff9d0),
                   (qsizetype)in_stack_fffffffffffff9c8);
        bVar1 = QSharedPointer::operator_cast_to_bool((QSharedPointer<QRelation> *)0x15a5f8);
        if (bVar1) {
          QList<QSharedPointer<QRelation>_>::at
                    ((QList<QSharedPointer<QRelation>_> *)in_stack_fffffffffffff9b0,
                     CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
          QSharedPointer<QRelation>::operator->((QSharedPointer<QRelation> *)0x15a61c);
          QSqlRelation::QSqlRelation
                    ((QSqlRelation *)in_stack_fffffffffffff9b0,
                     (QSqlRelation *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
        }
        else {
          QSqlRelation::QSqlRelation((QSqlRelation *)in_stack_fffffffffffff9b0);
        }
        QSharedPointer<QRelation>::~QSharedPointer((QSharedPointer<QRelation> *)0x15a648);
        local_228 = 0xaaaaaaaaaaaaaaaa;
        local_220 = 0xaaaaaaaaaaaaaaaa;
        local_218 = 0xaaaaaaaaaaaaaaaa;
        in_stack_fffffffffffff9c8 = pQVar7;
        QSqlTableModel::tableName((QSqlTableModel *)in_stack_fffffffffffff9b8);
        this_00 = (QByteArrayView *)QSqlDatabase::driver(&(pQVar7->super_QSqlTableModelPrivate).db);
        QSqlRecord::fieldName((QSqlRecord *)in_stack_fffffffffffff9c8,(int)((ulong)this_00 >> 0x20))
        ;
        (**(code **)(*(long *)&this_00->m_size + 0xa0))(local_258,this_00,local_270,0);
        QSqlRelationalTableModelPrivate::fullyQualifiedFieldName
                  ((QSqlRelationalTableModelPrivate *)
                   CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
                   (QString *)CONCAT44(iVar3,in_stack_fffffffffffff9d0),
                   (QString *)in_stack_fffffffffffff9c8);
        QString::~QString((QString *)0x15a713);
        QString::~QString((QString *)0x15a720);
        QString::~QString((QString *)0x15a72d);
        bVar1 = QSqlRelation::isValid((QSqlRelation *)in_stack_fffffffffffff9b0);
        if (bVar1) {
          local_288 = 0xaaaaaaaaaaaaaaaa;
          local_280 = 0xaaaaaaaaaaaaaaaa;
          local_278 = 0xaaaaaaaaaaaaaaaa;
          QSqlRelationalTableModelSql::relTablePrefix
                    ((int)((ulong)in_stack_fffffffffffff9c8 >> 0x20));
          local_2a0.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
          local_2a0.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
          local_2a0.d.size = -0x5555555555555556;
          in_stack_fffffffffffff9b8 = pQVar7;
          QSqlRelation::displayColumn
                    ((QSqlRelation *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
          QSqlRelationalTableModelPrivate::fullyQualifiedFieldName
                    ((QSqlRelationalTableModelPrivate *)
                     CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
                     (QString *)CONCAT44(iVar3,in_stack_fffffffffffff9d0),
                     (QString *)in_stack_fffffffffffff9c8);
          QString::~QString((QString *)0x15a7fc);
          QList<QString>::operator[]
                    ((QList<QString> *)in_stack_fffffffffffff9b0,
                     CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
          iVar6 = QHash<QString,_int>::value
                            ((QHash<QString,_int> *)in_stack_fffffffffffff9b8,
                             (QString *)in_stack_fffffffffffff9b0);
          uVar12 = (undefined2)in_stack_fffffffffffffa08.i;
          if (1 < iVar6) {
            local_2d0 = 0xaaaaaaaaaaaaaaaa;
            local_2c8 = 0xaaaaaaaaaaaaaaaa;
            local_2c0 = 0xaaaaaaaaaaaaaaaa;
            QSqlRelation::tableName
                      ((QSqlRelation *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8)
                      );
            QVar2 = QChar::fromLatin1((char)in_stack_fffffffffffff9ac);
            in_stack_fffffffffffffa08.i = CONCAT22(QVar2.ucs,uVar12);
            QFlags<QString::SectionFlag>::QFlags
                      ((QFlags<QString::SectionFlag> *)in_stack_fffffffffffff9b0,
                       in_stack_fffffffffffff9ac);
            QString::section((QString *)
                             CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
                             (QChar)(char16_t)((uint)iVar13 >> 0x10),
                             CONCAT44(iVar3,in_stack_fffffffffffff9d0),
                             (qsizetype)in_stack_fffffffffffff9c8,
                             (SectionFlags)in_stack_fffffffffffffa08.i);
            QString::~QString((QString *)0x15a8c3);
            pQVar8 = QSqlDatabase::driver(&(pQVar7->super_QSqlTableModelPrivate).db);
            uVar9 = (**(code **)(*(long *)pQVar8 + 0xf0))(pQVar8,&local_2d0,1);
            if ((uVar9 & 1) != 0) {
              pQVar8 = QSqlDatabase::driver(&(pQVar7->super_QSqlTableModelPrivate).db);
              (**(code **)(*(long *)pQVar8 + 0xf8))(local_308,pQVar8,&local_2d0,1);
              QString::operator=((QString *)in_stack_fffffffffffff9b0,
                                 (QString *)
                                 CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
              QString::~QString((QString *)0x15a947);
            }
            local_320 = 0xaaaaaaaaaaaaaaaa;
            local_318 = 0xaaaaaaaaaaaaaaaa;
            local_310 = 0xaaaaaaaaaaaaaaaa;
            QSqlRelation::displayColumn
                      ((QSqlRelation *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8)
                      );
            pQVar8 = QSqlDatabase::driver(&(pQVar7->super_QSqlTableModelPrivate).db);
            uVar9 = (**(code **)(*(long *)pQVar8 + 0xf0))(pQVar8,&local_320,0);
            if ((uVar9 & 1) != 0) {
              pQVar8 = QSqlDatabase::driver(&(pQVar7->super_QSqlTableModelPrivate).db);
              (**(code **)(*(long *)pQVar8 + 0xf8))(local_338,pQVar8,&local_320,0);
              QString::operator=((QString *)in_stack_fffffffffffff9b0,
                                 (QString *)
                                 CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
              QString::~QString((QString *)0x15aa07);
            }
            local_350 = 0xaaaaaaaaaaaaaaaa;
            local_348 = 0xaaaaaaaaaaaaaaaa;
            local_340 = 0xaaaaaaaaaaaaaaaa;
            QByteArrayView::QByteArrayView<9ul>(this_00,(char (*) [9])in_stack_fffffffffffff9b8);
            QVar11.m_data = local_378;
            QVar11.m_size = (qsizetype)local_368;
            QString::fromLatin1(QVar11);
            QList<QString>::operator[]
                      ((QList<QString> *)in_stack_fffffffffffff9b0,
                       CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
            iVar6 = QHash<QString,_int>::value
                              ((QHash<QString,_int> *)in_stack_fffffffffffff9b8,
                               (QString *)in_stack_fffffffffffff9b0);
            QString::number((int)&local_390,iVar6);
            in_R8 = &local_390;
            QString::arg<QString&,QString&,QString>
                      ((QString *)CONCAT44(iVar4,in_stack_fffffffffffff9e0),
                       (QString *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
                       (QString *)CONCAT44(iVar3,in_stack_fffffffffffff9d0),
                       (QString *)in_stack_fffffffffffff9c8);
            QString::~QString((QString *)0x15aad5);
            QString::~QString((QString *)0x15aae2);
            pQVar8 = QSqlDatabase::driver(&(pQVar7->super_QSqlTableModelPrivate).db);
            (**(code **)(*(long *)pQVar8 + 0x100))(pQVar8,0);
            QString::truncate((longlong)&local_350);
            pQVar8 = QSqlDatabase::driver(&(pQVar7->super_QSqlTableModelPrivate).db);
            (**(code **)(*(long *)pQVar8 + 0xa0))(local_3a8,pQVar8,&local_350,0);
            QString::operator=((QString *)in_stack_fffffffffffff9b0,
                               (QString *)
                               CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
            QString::~QString((QString *)0x15ab62);
            QSqlQueryModelSql::as
                      ((QString *)CONCAT44(iVar4,in_stack_fffffffffffff9e0),
                       (QString *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8));
            QString::operator=(&local_2a0,(QString *)local_3c0);
            QString::~QString((QString *)0x15aba1);
            QList<QString>::operator[]
                      ((QList<QString> *)in_stack_fffffffffffff9b0,
                       CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
            piVar10 = QHash<QString,_int>::operator[]
                                ((QHash<QString,_int> *)this_00,(QString *)in_stack_fffffffffffff9b8
                                );
            *piVar10 = *piVar10 + -1;
            QString::~QString((QString *)0x15abd7);
            QString::~QString((QString *)0x15abe4);
            QString::~QString((QString *)0x15abf1);
          }
          QSqlQueryModelSql::comma(a,(QString *)CONCAT44(iVar4,in_stack_fffffffffffff9e0));
          QString::operator=((QString *)&local_170,(QString *)local_3d8);
          QString::~QString((QString *)0x15ac30);
          local_3f0 = 0xaaaaaaaaaaaaaaaa;
          local_3e8 = 0xaaaaaaaaaaaaaaaa;
          local_3e0 = 0xaaaaaaaaaaaaaaaa;
          QSqlRelation::tableName
                    ((QSqlRelation *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
          QSqlQueryModelSql::concat(a,(QString *)CONCAT44(iVar4,in_stack_fffffffffffff9e0));
          QString::~QString((QString *)0x15ac9c);
          local_420 = 0xaaaaaaaaaaaaaaaa;
          local_418 = 0xaaaaaaaaaaaaaaaa;
          local_410 = 0xaaaaaaaaaaaaaaaa;
          in_stack_fffffffffffff9b0 = pQVar7;
          QSqlRelation::indexColumn
                    ((QSqlRelation *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
          QSqlRelationalTableModelPrivate::fullyQualifiedFieldName
                    ((QSqlRelationalTableModelPrivate *)
                     CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
                     (QString *)CONCAT44(iVar3,in_stack_fffffffffffff9d0),
                     (QString *)in_stack_fffffffffffff9c8);
          QString::~QString((QString *)0x15ad17);
          local_450 = 0xaaaaaaaaaaaaaaaa;
          local_448 = 0xaaaaaaaaaaaaaaaa;
          local_440 = 0xaaaaaaaaaaaaaaaa;
          QSqlQueryModelSql::eq
                    ((QString *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
                     (QString *)CONCAT44(iVar3,in_stack_fffffffffffff9d0));
          if (pQVar7->joinMode == InnerJoin) {
            QSqlQueryModelSql::comma(a,(QString *)CONCAT44(iVar4,in_stack_fffffffffffff9e0));
            QString::operator=(&local_1a0,(QString *)local_468);
            QString::~QString((QString *)0x15adb2);
            QSqlQueryModelSql::et
                      ((QString *)CONCAT44(iVar4,in_stack_fffffffffffff9e0),
                       (QString *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8));
            QString::operator=(&local_188,(QString *)local_480);
            QString::~QString((QString *)0x15adf1);
          }
          else {
            QSqlQueryModelSql::leftJoin((QString *)in_stack_fffffffffffff9c8);
            QSqlQueryModelSql::concat(a,(QString *)CONCAT44(iVar4,in_stack_fffffffffffff9e0));
            QString::operator=(&local_1a0,(QString *)local_498);
            QString::~QString((QString *)0x15ae4a);
            QString::~QString((QString *)0x15ae57);
            QSqlQueryModelSql::on((QString *)in_stack_fffffffffffff9c8);
            QSqlQueryModelSql::concat(a,(QString *)CONCAT44(iVar4,in_stack_fffffffffffff9e0));
            QString::operator=(&local_1a0,(QString *)local_4c8);
            QString::~QString((QString *)0x15aeab);
            QString::~QString((QString *)0x15aeb8);
          }
          QString::~QString((QString *)0x15aec5);
          QString::~QString((QString *)0x15aed2);
          QString::~QString((QString *)0x15aedf);
          QString::~QString((QString *)0x15aeec);
          QString::~QString((QString *)0x15aef9);
        }
        else {
          QSqlQueryModelSql::comma(a,(QString *)CONCAT44(iVar4,in_stack_fffffffffffff9e0));
          QString::operator=((QString *)&local_170,(QString *)local_4f8);
          QString::~QString((QString *)0x15af3a);
        }
        QString::~QString((QString *)0x15af47);
        QSqlRelation::~QSqlRelation((QSqlRelation *)in_stack_fffffffffffff9b0);
        iVar3 = iVar13 + 1;
      }
      bVar1 = QString::isEmpty((QString *)0x15af71);
      if (bVar1) {
        QString::QString((QString *)0x15af81);
      }
      else {
        local_510 = 0xaaaaaaaaaaaaaaaa;
        local_508 = 0xaaaaaaaaaaaaaaaa;
        local_500 = 0xaaaaaaaaaaaaaaaa;
        QSqlQueryModelSql::select((int)local_528,&local_170,__writefds,__exceptfds,in_R8);
        QSqlQueryModelSql::concat(a,(QString *)CONCAT44(iVar4,in_stack_fffffffffffff9e0));
        QString::~QString((QString *)0x15affa);
        local_540 = 0xaaaaaaaaaaaaaaaa;
        local_538 = 0xaaaaaaaaaaaaaaaa;
        local_530 = 0xaaaaaaaaaaaaaaaa;
        QSqlQueryModelSql::paren((QString *)in_stack_fffffffffffff9b0);
        QSqlTableModel::filter((QSqlTableModel *)in_stack_fffffffffffff9b8);
        QSqlQueryModelSql::paren((QString *)in_stack_fffffffffffff9b0);
        QSqlQueryModelSql::et
                  ((QString *)CONCAT44(iVar4,in_stack_fffffffffffff9e0),
                   (QString *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8));
        QSqlQueryModelSql::where((QString *)in_stack_fffffffffffff9c8);
        QString::~QString((QString *)0x15b0a2);
        QString::~QString((QString *)0x15b0af);
        QString::~QString((QString *)0x15b0bc);
        QString::~QString((QString *)0x15b0c9);
        QSqlQueryModelSql::concat(a,(QString *)CONCAT44(iVar4,in_stack_fffffffffffff9e0));
        (**(code **)(*in_RSI + 0x1f0))(local_5d0);
        QSqlQueryModelSql::concat(a,(QString *)CONCAT44(iVar4,in_stack_fffffffffffff9e0));
        QString::~QString((QString *)0x15b123);
        QString::~QString((QString *)0x15b130);
        QString::~QString((QString *)0x15b145);
        QString::~QString((QString *)0x15b152);
      }
      QString::~QString((QString *)0x15b15f);
      QString::~QString((QString *)0x15b16c);
      QString::~QString((QString *)0x15b179);
      QList<QString>::~QList((QList<QString> *)0x15b186);
      QHash<QString,_int>::~QHash((QHash<QString,_int> *)in_stack_fffffffffffff9b0);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QString QSqlRelationalTableModel::selectStatement() const
{
    Q_D(const QSqlRelationalTableModel);

    if (tableName().isEmpty())
        return QString();
    if (d->relations.isEmpty())
        return QSqlTableModel::selectStatement();

    // Count how many times each field name occurs in the record
    QHash<QString, int> fieldNames;
    QStringList fieldList;
    for (int i = 0; i < d->baseRec.count(); ++i) {
        QSqlRelation relation = d->relations.value(i) ? d->relations.at(i)->rel : QSqlRelation();
        QString name;
        if (relation.isValid()) {
            // Count the display column name, not the original foreign key
            name = relation.displayColumn();
            if (d->db.driver()->isIdentifierEscaped(name, QSqlDriver::FieldName))
                name = d->db.driver()->stripDelimiters(name, QSqlDriver::FieldName);

            const QSqlRecord rec = database().record(relation.tableName());
            for (int i = 0; i < rec.count(); ++i) {
                if (name.compare(rec.fieldName(i), Qt::CaseInsensitive) == 0) {
                    name = rec.fieldName(i);
                    break;
                }
            }
        }
        else {
            name = d->baseRec.fieldName(i);
        }
        fieldNames[name] = fieldNames.value(name, 0) + 1;
        fieldList.append(name);
    }

    QString fList;
    QString conditions;
    QString from = SqlrTm::from(tableName());
    for (int i = 0; i < d->baseRec.count(); ++i) {
        QSqlRelation relation = d->relations.value(i) ? d->relations.at(i)->rel : QSqlRelation();
        const QString tableField = d->fullyQualifiedFieldName(tableName(), d->db.driver()->escapeIdentifier(d->baseRec.fieldName(i), QSqlDriver::FieldName));
        if (relation.isValid()) {
            const QString relTableAlias = SqlrTm::relTablePrefix(i);
            QString displayTableField = d->fullyQualifiedFieldName(relTableAlias, relation.displayColumn());

            // Duplicate field names must be aliased
            if (fieldNames.value(fieldList[i]) > 1) {
                QString relTableName = relation.tableName().section(QChar::fromLatin1('.'), -1, -1);
                if (d->db.driver()->isIdentifierEscaped(relTableName, QSqlDriver::TableName))
                    relTableName = d->db.driver()->stripDelimiters(relTableName, QSqlDriver::TableName);
                QString displayColumn = relation.displayColumn();
                if (d->db.driver()->isIdentifierEscaped(displayColumn, QSqlDriver::FieldName))
                    displayColumn = d->db.driver()->stripDelimiters(displayColumn, QSqlDriver::FieldName);
                QString alias = QString::fromLatin1("%1_%2_%3")
                                      .arg(relTableName, displayColumn, QString::number(fieldNames.value(fieldList[i])));
                alias.truncate(d->db.driver()->maximumIdentifierLength(QSqlDriver::FieldName));
                alias = d->db.driver()->escapeIdentifier(alias, QSqlDriver::FieldName);
                displayTableField = SqlrTm::as(displayTableField, alias);
                --fieldNames[fieldList[i]];
            }

            fList = SqlrTm::comma(fList, displayTableField);

            // Join related table
            const QString tblexpr = SqlrTm::concat(relation.tableName(), relTableAlias);
            const QString relTableField = d->fullyQualifiedFieldName(relTableAlias, relation.indexColumn());
            const QString cond = SqlrTm::eq(tableField, relTableField);
            if (d->joinMode == QSqlRelationalTableModel::InnerJoin) {
                // FIXME: InnerJoin code is known to be broken.
                // Use LeftJoin mode if you want correct behavior.
                from = SqlrTm::comma(from, tblexpr);
                conditions = SqlrTm::et(conditions, cond);
            } else {
                from = SqlrTm::concat(from, SqlrTm::leftJoin(tblexpr));
                from = SqlrTm::concat(from, SqlrTm::on(cond));
            }
        } else {
            fList = SqlrTm::comma(fList, tableField);
        }
    }

    if (fList.isEmpty())
        return QString();

    const QString stmt = SqlrTm::concat(SqlrTm::select(fList), from);
    const QString where = SqlrTm::where(SqlrTm::et(SqlrTm::paren(conditions), SqlrTm::paren(filter())));
    return SqlrTm::concat(SqlrTm::concat(stmt, where), orderByClause());
}